

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTSDA.cpp
# Opt level: O1

void __thiscall chrono::ChLinkTSDA::Update(ChLinkTSDA *this,double time,bool update_assets)

{
  double *pdVar1;
  double *pdVar2;
  ChBodyFrame *pCVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Index size;
  long lVar12;
  Index index;
  ulong uVar13;
  long lVar14;
  double *pdVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ChStateDelta state_w;
  ChState state_x;
  ChStateDelta local_70;
  double *local_58;
  double local_50;
  ChState local_48;
  
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime = time;
  local_50 = time;
  ChState::ChState(&local_48,(long)this->m_nstates + 0xe,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&local_70,(long)this->m_nstates + 0xc,(ChIntegrable *)0x0);
  pCVar3 = (this->super_ChLink).Body1;
  (**(code **)((long)*(double *)
                      ((long)&pCVar3[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data + 0x40) + 0x210))
            ((double *)
             ((long)&pCVar3[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
             0x40),0,&local_48);
  pCVar3 = (this->super_ChLink).Body2;
  (**(code **)((long)*(double *)
                      ((long)&pCVar3[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data + 0x40) + 0x210))
            ((double *)
             ((long)&pCVar3[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
             0x40),7,&local_48);
  pCVar3 = (this->super_ChLink).Body1;
  (**(code **)((long)*(double *)
                      ((long)&pCVar3[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data + 0x40) + 0x218))
            ((double *)
             ((long)&pCVar3[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
             0x40),0,&local_70);
  pCVar3 = (this->super_ChLink).Body2;
  (**(code **)((long)*(double *)
                      ((long)&pCVar3[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data + 0x40) + 0x218))
            ((double *)
             ((long)&pCVar3[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
             0x40),6,&local_70);
  if (this->m_variables != (ChVariablesGenericDiagonalMass *)0x0) {
    uVar18 = (ulong)this->m_nstates;
    if (local_48.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        (double *)0x0 && (long)uVar18 < 0) goto LAB_005a9930;
    if ((this->m_nstates < 0) ||
       ((long)(local_48.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
              uVar18) < 0xe)) goto LAB_005a994f;
    pdVar15 = local_48.super_ChVectorDynamic<double>.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 0xe;
    uVar13 = uVar18;
    if ((((ulong)pdVar15 & 7) == 0) &&
       (uVar13 = (ulong)(-((uint)((ulong)pdVar15 >> 3) & 0x1fffffff) & 7),
       (long)uVar18 <= (long)uVar13)) {
      uVar13 = uVar18;
    }
    uVar19 = uVar18 - uVar13;
    uVar16 = uVar19 + 7;
    if (-1 < (long)uVar19) {
      uVar16 = uVar19;
    }
    if (0 < (long)uVar13) {
      local_58 = pdVar15;
      memset(pdVar15,0,uVar13 * 8);
      pdVar15 = local_58;
    }
    lVar14 = (uVar16 & 0xfffffffffffffff8) + uVar13;
    if (7 < (long)uVar19) {
      lVar12 = uVar13 + 8;
      if ((long)(uVar13 + 8) < lVar14) {
        lVar12 = lVar14;
      }
      memset(pdVar15 + uVar13,0,(~uVar13 + lVar12 & 0xfffffffffffffff8) * 8 + 0x40);
    }
    if (uVar18 - lVar14 != 0 && lVar14 <= (long)uVar18) {
      memset(pdVar15 + ((long)uVar16 >> 3) * 8 + uVar13,0,(uVar18 - lVar14) * 8);
    }
    uVar18 = (ulong)this->m_nstates;
    if (local_70.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        (double *)0x0 && (long)uVar18 < 0) goto LAB_005a9930;
    if ((this->m_nstates < 0) ||
       ((long)(local_70.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
              uVar18) < 0xc)) goto LAB_005a994f;
    if ((this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != uVar18) {
      __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                    "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                   );
    }
    pdVar15 = local_70.super_ChVectorDynamic<double>.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 0xc;
    uVar13 = uVar18;
    if ((((ulong)pdVar15 & 7) == 0) &&
       (uVar13 = (ulong)(-((uint)((ulong)pdVar15 >> 3) & 0x1fffffff) & 7),
       (long)uVar18 <= (long)uVar13)) {
      uVar13 = uVar18;
    }
    pdVar4 = (this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    uVar19 = uVar18 - uVar13;
    uVar16 = uVar19 + 7;
    if (-1 < (long)uVar19) {
      uVar16 = uVar19;
    }
    if (0 < (long)uVar13) {
      uVar17 = 0;
      do {
        pdVar15[uVar17] = pdVar4[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar13 != uVar17);
    }
    uVar16 = (uVar16 & 0xfffffffffffffff8) + uVar13;
    if (7 < (long)uVar19) {
      do {
        pdVar1 = pdVar4 + uVar13;
        dVar5 = pdVar1[1];
        dVar6 = pdVar1[2];
        dVar7 = pdVar1[3];
        dVar8 = pdVar1[4];
        dVar9 = pdVar1[5];
        dVar10 = pdVar1[6];
        dVar11 = pdVar1[7];
        pdVar2 = pdVar15 + uVar13;
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar5;
        pdVar2[2] = dVar6;
        pdVar2[3] = dVar7;
        pdVar2[4] = dVar8;
        pdVar2[5] = dVar9;
        pdVar2[6] = dVar10;
        pdVar2[7] = dVar11;
        uVar13 = uVar13 + 8;
      } while ((long)uVar13 < (long)uVar16);
    }
    if ((long)uVar16 < (long)uVar18) {
      do {
        pdVar15[uVar16] = pdVar4[uVar16];
        uVar16 = uVar16 + 1;
      } while (uVar18 != uVar16);
    }
  }
  ComputeQ(this,local_50,&local_48,&local_70,&this->m_Qforce);
  if (this->m_stiff == true) {
    if (this->m_jacobians == (SpringJacobians *)0x0) {
      CreateJacobianMatrices(this);
    }
    ComputeJacobians(this,local_50,&local_48,&local_70);
    pdVar15 = local_70.super_ChVectorDynamic<double>.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    uVar18 = (ulong)this->m_nstates;
    if (local_70.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        (double *)0x0 && (long)uVar18 < 0) {
LAB_005a9930:
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                    "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                   );
    }
    if ((this->m_nstates < 0) ||
       ((long)(local_70.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
              uVar18) < 0xc)) {
LAB_005a994f:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    if ((this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != uVar18) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 uVar18,1);
    }
    uVar13 = (this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if (uVar13 != uVar18) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, T1 = double, T2 = double]"
                   );
    }
    pdVar4 = (this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    uVar18 = uVar13 + 7;
    if (-1 < (long)uVar13) {
      uVar18 = uVar13;
    }
    uVar18 = uVar18 & 0xfffffffffffffff8;
    if (7 < (long)uVar13) {
      lVar14 = 0;
      do {
        pdVar2 = pdVar15 + lVar14 + 0xc;
        dVar5 = pdVar2[1];
        dVar6 = pdVar2[2];
        dVar7 = pdVar2[3];
        dVar8 = pdVar2[4];
        dVar9 = pdVar2[5];
        dVar10 = pdVar2[6];
        dVar11 = pdVar2[7];
        pdVar1 = pdVar4 + lVar14;
        *pdVar1 = *pdVar2;
        pdVar1[1] = dVar5;
        pdVar1[2] = dVar6;
        pdVar1[3] = dVar7;
        pdVar1[4] = dVar8;
        pdVar1[5] = dVar9;
        pdVar1[6] = dVar10;
        pdVar1[7] = dVar11;
        lVar14 = lVar14 + 8;
      } while (lVar14 < (long)uVar18);
    }
    if ((long)uVar18 < (long)uVar13) {
      do {
        pdVar4[uVar18] = pdVar15[uVar18 + 0xc];
        uVar18 = uVar18 + 1;
      } while (uVar13 != uVar18);
    }
  }
  ChPhysicsItem::Update
            ((ChPhysicsItem *)this,
             (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime,
             update_assets);
  if (local_70.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_70.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  if (local_48.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_48.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  return;
}

Assistant:

void ChLinkTSDA::Update(double time, bool update_assets) {
    ChTime = time;

    // Pack states and state derivatives for the two connected bodies and ODE states (if present)
    ChState state_x(14 + m_nstates, nullptr);
    ChStateDelta state_w(12 + m_nstates, nullptr);

    static_cast<ChBody*>(Body1)->LoadableGetStateBlock_x(0, state_x);
    static_cast<ChBody*>(Body2)->LoadableGetStateBlock_x(7, state_x);

    static_cast<ChBody*>(Body1)->LoadableGetStateBlock_w(0, state_w);
    static_cast<ChBody*>(Body2)->LoadableGetStateBlock_w(6, state_w);

    if (m_variables) {
        state_x.segment(14, m_nstates).setZero();
        state_w.segment(12, m_nstates) = m_states;
    }

    // Compute forcing terms at current states (this also updates link kinematics)
    ComputeQ(time, state_x, state_w, m_Qforce);

    // Compute Jacobians (if needed)
    if (m_stiff) {
        if (!m_jacobians)
            CreateJacobianMatrices();
        // Compute Jacobian matrices
        ComputeJacobians(time, state_x, state_w);
        // Restore the states (may have been perturbed during Jacobian calculation)
        m_states = state_w.segment(12, m_nstates);
    }

    // Update assets
    ChPhysicsItem::Update(ChTime, update_assets);
}